

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

QLatin1StringView __thiscall
QMimeBinaryProvider::iconForMime
          (QMimeBinaryProvider *this,CacheFile *cacheFile,int posListOffset,QByteArray *inputMime)

{
  int iVar1;
  uchar *puVar2;
  long lVar3;
  char *str2;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  QLatin1StringView QVar10;
  
  uVar7 = *(uint *)(cacheFile->data + posListOffset);
  uVar4 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  uVar7 = *(uint *)(cacheFile->data + (int)uVar4);
  uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  lVar3 = 0;
  if (0 < (int)uVar7) {
    iVar8 = uVar7 - 1;
    iVar6 = 0;
    do {
      str2 = (inputMime->d).ptr;
      if (str2 == (char *)0x0) {
        str2 = &QByteArray::_empty;
      }
      uVar5 = (uint)(iVar8 + iVar6) >> 1;
      lVar9 = (long)(int)(uVar4 + 4 + uVar5 * 8);
      uVar7 = *(uint *)(cacheFile->data + lVar9);
      iVar1 = qstrcmp((char *)(cacheFile->data +
                              (int)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8
                                   | uVar7 << 0x18)),str2);
      if (iVar1 < 0) {
        iVar6 = uVar5 + 1;
      }
      else {
        if (iVar1 == 0) {
          uVar7 = *(uint *)(cacheFile->data + lVar9 + 4);
          puVar2 = cacheFile->data +
                   (int)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                        uVar7 << 0x18);
          lVar3 = -1;
          do {
            lVar9 = lVar3 + 1;
            lVar3 = lVar3 + 1;
          } while (puVar2[lVar9] != '\0');
          goto LAB_004ab8c8;
        }
        iVar8 = uVar5 - 1;
      }
    } while (iVar6 <= iVar8);
  }
  puVar2 = (uchar *)0x0;
LAB_004ab8c8:
  QVar10.m_data = (char *)puVar2;
  QVar10.m_size = lVar3;
  return QVar10;
}

Assistant:

QLatin1StringView QMimeBinaryProvider::iconForMime(CacheFile *cacheFile, int posListOffset,
                                                   const QByteArray &inputMime)
{
    const int iconsListOffset = cacheFile->getUint32(posListOffset);
    const int numIcons = cacheFile->getUint32(iconsListOffset);
    int begin = 0;
    int end = numIcons - 1;
    while (begin <= end) {
        const int medium = (begin + end) / 2;
        const int off = iconsListOffset + 4 + 8 * medium;
        const int mimeOffset = cacheFile->getUint32(off);
        const char *mime = cacheFile->getCharStar(mimeOffset);
        const int cmp = qstrcmp(mime, inputMime);
        if (cmp < 0)
            begin = medium + 1;
        else if (cmp > 0)
            end = medium - 1;
        else {
            const int iconOffset = cacheFile->getUint32(off + 4);
            return QLatin1StringView(cacheFile->getCharStar(iconOffset));
        }
    }
    return QLatin1StringView();
}